

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::readValueFrom
          (TypedAttribute<Imf_2_5::Chromaticities> *this,IStream *is,int size,int version)

{
  uchar b [4];
  float local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).red.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).red.y = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).green.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).green.y = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).blue.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).blue.y = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).white.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).white.y = local_1c;
  return;
}

Assistant:

void
ChromaticitiesAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.red.x);
    Xdr::read <StreamIO> (is, _value.red.y);
    Xdr::read <StreamIO> (is, _value.green.x);
    Xdr::read <StreamIO> (is, _value.green.y);
    Xdr::read <StreamIO> (is, _value.blue.x);
    Xdr::read <StreamIO> (is, _value.blue.y);
    Xdr::read <StreamIO> (is, _value.white.x);
    Xdr::read <StreamIO> (is, _value.white.y);
}